

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O2

Nf_Mat_t * Nf_ObjMatchBest(Nf_Man_t *p,int i,int c)

{
  uint uVar1;
  uint uVar2;
  Nf_Obj_t *pNVar3;
  Nf_Mat_t *pNVar4;
  
  pNVar3 = p->pNfObjs;
  uVar1 = *(uint *)pNVar3[i].M[(uint)c];
  uVar2 = *(uint *)(pNVar3[i].M[(uint)c] + 1);
  if ((int)(uVar2 ^ uVar1) < 0) {
    pNVar4 = (Nf_Mat_t *)0x0;
    if ((int)uVar1 < 0) {
      pNVar4 = pNVar3[i].M[(uint)c];
    }
    if ((int)uVar2 < 0) {
      pNVar4 = pNVar3[i].M[(uint)c] + 1;
    }
    return pNVar4;
  }
  __assert_fail("pD->fBest != pA->fBest",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                ,0x583,"Nf_Mat_t *Nf_ObjMatchBest(Nf_Man_t *, int, int)");
}

Assistant:

static inline Nf_Mat_t * Nf_ObjMatchBest( Nf_Man_t * p, int i, int c )             
{
    Nf_Mat_t * pD = Nf_ObjMatchD(p, i, c);
    Nf_Mat_t * pA = Nf_ObjMatchA(p, i, c);
    assert( pD->fBest != pA->fBest );
    //assert( Nf_ObjMapRefNum(p, i, c) > 0 );
    if ( pA->fBest )
        return pA;
    if ( pD->fBest )
        return pD;
    return NULL;
}